

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_0::TestErrorHandler::handleClientProtocolError
          (TestErrorHandler *this,ProtocolError protocolError,Response *response)

{
  char *pcVar1;
  size_t sVar2;
  Maybe<kj::HttpService::Response_&> in_RDX;
  bool in_R8B;
  String *in_R9;
  ArrayPtr<const_unsigned_char> bytes;
  StringPtr statusText;
  String local_78;
  String local_58;
  String local_38;
  
  bytes.size_ = 0;
  bytes.ptr = (uchar *)protocolError.rawContent.size_;
  kj::_::encodeCEscapeImpl(&local_38,(_ *)protocolError.rawContent.ptr,bytes,in_R8B);
  str<char_const(&)[21],kj::StringPtr&,char_const(&)[16],kj::String>
            (&local_78,(kj *)"Saw protocol error: ",(char (*) [21])&protocolError.description,
             (StringPtr *)"; rawContent = ",(char (*) [16])&local_38,in_R9);
  sVar2 = local_38.content.size_;
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  local_58.content.ptr = local_78.content.ptr;
  local_58.content.size_ = local_78.content.size_;
  local_58.content.disposer = local_78.content.disposer;
  local_78.content.ptr = (char *)0x0;
  local_78.content.size_ = 0;
  statusText.content.size_ = 0xc;
  statusText.content.ptr = "Bad Request";
  sendError(this,400,statusText,&local_58,in_RDX);
  sVar2 = local_58.content.size_;
  pcVar1 = local_58.content.ptr;
  if (local_58.content.ptr != (char *)0x0) {
    local_58.content.ptr = (char *)0x0;
    local_58.content.size_ = 0;
    (**(local_58.content.disposer)->_vptr_ArrayDisposer)
              (local_58.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_78.content.size_;
  pcVar1 = local_78.content.ptr;
  if (local_78.content.ptr != (char *)0x0) {
    local_78.content.ptr = (char *)0x0;
    local_78.content.size_ = 0;
    (**(local_78.content.disposer)->_vptr_ArrayDisposer)
              (local_78.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> handleClientProtocolError(
      HttpHeaders::ProtocolError protocolError, kj::HttpService::Response& response) override {
    // In a real error handler, you should redact `protocolError.rawContent`.
    auto message = kj::str("Saw protocol error: ", protocolError.description, "; rawContent = ",
        encodeCEscape(protocolError.rawContent));
    return sendError(400, "Bad Request", kj::mv(message), response);
  }